

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmWhileCommand.h
# Opt level: O0

cmCommand * __thiscall cmWhileCommand::Clone(cmWhileCommand *this)

{
  cmCommand *this_00;
  cmWhileCommand *this_local;
  
  this_00 = (cmCommand *)operator_new(0x50);
  cmWhileCommand((cmWhileCommand *)this_00);
  return this_00;
}

Assistant:

virtual cmCommand* Clone()
    {
    return new cmWhileCommand;
    }